

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_2.h
# Opt level: O2

void __thiscall
dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::enqueue
          (queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>
           *this,directory *item)

{
  node *pnVar1;
  ulong uVar2;
  
  if (this->queue_size == 0) {
    pnVar1 = memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
             ::allocate(&this->pool);
    this->in = pnVar1;
    this->out = pnVar1;
    this->in_pos = 0;
    this->out_pos = 0;
  }
  else {
    uVar2 = this->in_pos;
    if (uVar2 < 0x14) {
      pnVar1 = this->in;
      goto LAB_002613e4;
    }
    pnVar1 = memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
             ::allocate(&this->pool);
    this->in->next = pnVar1;
    this->in_pos = 0;
    this->in = pnVar1;
  }
  uVar2 = 0;
LAB_002613e4:
  std::swap<dlib::directory::data>(&item->state,&pnVar1->item[uVar2].state);
  this->queue_size = this->queue_size + 1;
  this->in_pos = this->in_pos + 1;
  (*(this->super_enumerable<dlib::directory>)._vptr_enumerable[3])(this);
  return;
}

Assistant:

void queue_kernel_2<T,block_size,mem_manager>::
    enqueue (
        T& item
    )
    {
        if (queue_size == 0)
        {
            out = in = pool.allocate();
            in_pos = 0;
            out_pos = 0;
        }
        else if (in_pos >= block_size)
        {            
            in->next = pool.allocate();
            in_pos = 0;
            in = in->next;
        }

        exchange(item,in->item[in_pos]);
        ++in_pos;

        ++queue_size;

        // put the enumerator at the start
        reset();
    }